

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

bool __thiscall fsbridge::FileLock::TryLock(FileLock *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  flock lock;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool local_49;
  undefined2 local_48;
  undefined2 local_46;
  undefined8 local_40;
  undefined8 local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x20) == -1) {
    local_49 = false;
  }
  else {
    local_48 = 1;
    local_46 = 0;
    local_40 = 0;
    local_38 = 0;
    iVar1 = fcntl(*(int *)(in_RDI + 0x20),6,&local_48);
    if (iVar1 == -1) {
      GetErrorReason_abi_cxx11_();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,in_stack_fffffffffffffff0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      local_49 = false;
    }
    else {
      local_49 = true;
    }
  }
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == this_00) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool FileLock::TryLock()
{
    if (fd == -1) {
        return false;
    }

    struct flock lock;
    lock.l_type = F_WRLCK;
    lock.l_whence = SEEK_SET;
    lock.l_start = 0;
    lock.l_len = 0;
    if (fcntl(fd, F_SETLK, &lock) == -1) {
        reason = GetErrorReason();
        return false;
    }

    return true;
}